

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Chunk * __thiscall Arena::findChunk(Arena *this,size_t size)

{
  size_t sVar1;
  Chunk *pCVar2;
  uint8_t *puVar3;
  Arena *pAVar4;
  
  pAVar4 = this;
  do {
    pAVar4 = (Arena *)pAVar4->_chunks;
    if (pAVar4 == (Arena *)0x0) {
      pCVar2 = (Chunk *)sq_vm_malloc(this->_alloc_ctx,0x20);
      puVar3 = allocatePage(this,this->_chunkSize);
      sVar1 = this->_chunkSize;
      pCVar2->_next = this->_chunks;
      pCVar2->_start = puVar3;
      pCVar2->_ptr = puVar3;
      pCVar2->_size = sVar1;
      this->_chunks = pCVar2;
      return pCVar2;
    }
  } while (pAVar4->_alloc_ctx + ((long)pAVar4->_name - (long)pAVar4->_bigChunks) < size);
  return (Chunk *)pAVar4;
}

Assistant:

struct Chunk *findChunk(size_t size) {
        struct Chunk *ch = _chunks;
        while (ch) {
            if (size <= ch->left()) return ch;
            ch = ch->_next;
        }

        void *mem = SQ_MALLOC(_alloc_ctx, sizeof(Chunk));
        uint8_t *data = allocatePage(_chunkSize);
        ch = new(mem) Chunk(_chunks, data, _chunkSize);
        _chunks = ch;
        return ch;
    }